

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,int options
                  )

{
  xmlParserInputBufferPtr input;
  xmlParserInputPtr value;
  htmlDocPtr pxVar1;
  
  if (buffer != (char *)0x0 && ctxt != (htmlParserCtxtPtr)0x0) {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    input = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      value = xmlNewIOInputStream(ctxt,input,XML_CHAR_ENCODING_NONE);
      if (value != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,value);
        pxVar1 = htmlDoRead(ctxt,URL,encoding,options,1);
        return pxVar1;
      }
      xmlFreeParserInputBuffer(input);
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ctxt == NULL)
        return (NULL);
    if (buffer == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
	return(NULL);
    }

    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }

    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}